

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall
wallet::anon_unknown_5::WalletImpl::lockCoin(WalletImpl *this,COutPoint *output,bool write_to_db)

{
  long lVar1;
  byte bVar2;
  element_type *batch_00;
  byte in_DL;
  COutPoint *in_RSI;
  WalletDatabase *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff88;
  CWallet *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined8 in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_stack_ffffffffffffff88);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(bVar2,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,(char *)in_RDI,
             (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x18,0));
  if ((bVar2 & 1) == 0) {
    std::unique_ptr<wallet::WalletBatch,std::default_delete<wallet::WalletBatch>>::
    unique_ptr<std::default_delete<wallet::WalletBatch>,void>
              ((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)
               in_stack_ffffffffffffff88,(nullptr_t)0x1569343);
  }
  else {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (in_stack_ffffffffffffff88);
    CWallet::GetDatabase(in_stack_ffffffffffffff98);
    std::make_unique<wallet::WalletBatch,wallet::WalletDatabase&>(in_RDI);
  }
  batch_00 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_stack_ffffffffffffff88);
  _GLOBAL__N_1::std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::get
            ((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)
             in_stack_ffffffffffffff88);
  bVar2 = CWallet::LockCoin((CWallet *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
                            ,in_RSI,(WalletBatch *)batch_00);
  _GLOBAL__N_1::std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::
  ~unique_ptr((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)in_RSI);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool lockCoin(const COutPoint& output, const bool write_to_db) override
    {
        LOCK(m_wallet->cs_wallet);
        std::unique_ptr<WalletBatch> batch = write_to_db ? std::make_unique<WalletBatch>(m_wallet->GetDatabase()) : nullptr;
        return m_wallet->LockCoin(output, batch.get());
    }